

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

void __thiscall Fossilize::StateReplayer::forget_pipeline_handle_references(StateReplayer *this)

{
  StateReplayer *this_local;
  
  Impl::forget_pipeline_handle_references(this->impl);
  return;
}

Assistant:

void StateReplayer::forget_pipeline_handle_references()
{
	impl->forget_pipeline_handle_references();
}